

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcm.c
# Opt level: O2

void ghash_add_cipher(ghash_ctx *ctx,uint8_t *buf,size_t n)

{
  if (ctx->state != 2) {
    if (ctx->state != 1) {
      abort();
    }
    ghash_add_pad(ctx);
    ctx->state = 2;
  }
  ctx->len_cipher = ctx->len_cipher + n;
  ghash_add(ctx,buf,n);
  return;
}

Assistant:

static void ghash_add_cipher(ghash_ctx *ctx, const uint8_t *buf, size_t n)
{
  if (ctx->state == STATE_AAD)
  {
    ghash_add_pad(ctx);
    ctx->state = STATE_CIPHER;
  }
  
  assert(ctx->state == STATE_CIPHER);
  ctx->len_cipher += n;
  ghash_add(ctx, buf, n);
}